

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

lbool __thiscall Minisat::Solver::search(Solver *this,int nof_conflicts)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  bool bVar5;
  CRef confl_00;
  int iVar6;
  Size SVar7;
  uint uVar8;
  int iVar9;
  Lit p_00;
  Lit *pLVar10;
  Clause *c;
  int *piVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  int local_dc;
  lbool local_6e;
  uint8_t local_6d;
  int local_6c;
  lbool local_65;
  Lit local_64;
  Lit local_60;
  Lit p;
  Lit next;
  CRef cr;
  undefined1 local_38 [4];
  CRef confl;
  vec<Minisat::Lit,_int> learnt_clause;
  int local_20;
  int conflictC;
  int backtrack_level;
  int nof_conflicts_local;
  Solver *this_local;
  
  conflictC = nof_conflicts;
  _backtrack_level = this;
  if ((this->ok & 1U) == 0) {
    __assert_fail("ok",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                  ,0x2c0,"lbool Minisat::Solver::search(int)");
  }
  learnt_clause.cap = 0;
  vec<Minisat::Lit,_int>::vec((vec<Minisat::Lit,_int> *)local_38);
  this->starts = this->starts + 1;
  while( true ) {
    while (confl_00 = propagate(this), confl_00 != 0xffffffff) {
      this->conflicts = this->conflicts + 1;
      learnt_clause.cap = learnt_clause.cap + 1;
      iVar6 = decisionLevel(this);
      if (iVar6 == 0) {
        this_local._7_1_ = l_False.value;
        goto LAB_00110b60;
      }
      vec<Minisat::Lit,_int>::clear((vec<Minisat::Lit,_int> *)local_38,false);
      analyze(this,confl_00,(vec<Minisat::Lit,_int> *)local_38,&local_20);
      cancelUntil(this,local_20);
      SVar7 = vec<Minisat::Lit,_int>::size((vec<Minisat::Lit,_int> *)local_38);
      if (SVar7 == 1) {
        pLVar10 = vec<Minisat::Lit,_int>::operator[]((vec<Minisat::Lit,_int> *)local_38,0);
        uncheckedEnqueue(this,(Lit)pLVar10->x,0xffffffff);
      }
      else {
        next.x = ClauseAllocator::alloc(&this->ca,(vec<Minisat::Lit,_int> *)local_38,true);
        vec<unsigned_int,_int>::push(&this->learnts,(uint *)&next);
        attachClause(this,next.x);
        c = ClauseAllocator::operator[](&this->ca,next.x);
        claBumpActivity(this,c);
        pLVar10 = vec<Minisat::Lit,_int>::operator[]((vec<Minisat::Lit,_int> *)local_38,0);
        p.x = pLVar10->x;
        uncheckedEnqueue(this,p,next.x);
      }
      varDecayActivity(this);
      claDecayActivity(this);
      iVar6 = this->learntsize_adjust_cnt + -1;
      this->learntsize_adjust_cnt = iVar6;
      if (iVar6 == 0) {
        this->learntsize_adjust_confl = this->learntsize_adjust_inc * this->learntsize_adjust_confl;
        this->learntsize_adjust_cnt = (int)this->learntsize_adjust_confl;
        this->max_learnts = this->learntsize_inc * this->max_learnts;
        if (0 < this->verbosity) {
          uVar2 = this->conflicts;
          uVar3 = this->dec_vars;
          SVar7 = vec<int,_int>::size(&this->trail_lim);
          if (SVar7 == 0) {
            local_dc = vec<Minisat::Lit,_int>::size(&this->trail);
          }
          else {
            piVar11 = vec<int,_int>::operator[](&this->trail_lim,0);
            local_dc = *piVar11;
          }
          uVar8 = nClauses(this);
          uVar4 = this->clauses_literals;
          dVar13 = this->max_learnts;
          iVar6 = nLearnts(this);
          uVar1 = this->learnts_literals;
          auVar14._8_4_ = (int)(uVar1 >> 0x20);
          auVar14._0_8_ = uVar1;
          auVar14._12_4_ = 0x45300000;
          iVar9 = nLearnts(this);
          dVar12 = progressEstimate(this);
          printf("| %9d | %7d %8d %8d | %8d %8d %6.0f | %6.3f %% |\n",
                 ((auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / (double)iVar9,
                 dVar12 * 100.0,(ulong)(uint)uVar2,(ulong)(uint)((int)uVar3 - local_dc),(ulong)uVar8
                 ,(ulong)(uint)uVar4,(ulong)(uint)(int)dVar13,iVar6);
        }
      }
    }
    if (((-1 < conflictC) && (conflictC <= learnt_clause.cap)) ||
       (bVar5 = withinBudget(this), !bVar5)) break;
    iVar6 = decisionLevel(this);
    if ((iVar6 == 0) && (bVar5 = simplify(this), !bVar5)) {
      this_local._7_1_ = l_False.value;
      goto LAB_00110b60;
    }
    SVar7 = vec<unsigned_int,_int>::size(&this->learnts);
    iVar6 = nAssigns(this);
    if (this->max_learnts <= (double)(SVar7 - iVar6)) {
      reduceDB(this);
    }
    local_60.x = -2;
    while( true ) {
      iVar6 = decisionLevel(this);
      SVar7 = vec<Minisat::Lit,_int>::size(&this->assumptions);
      if (SVar7 <= iVar6) break;
      iVar6 = decisionLevel(this);
      pLVar10 = vec<Minisat::Lit,_int>::operator[](&this->assumptions,iVar6);
      local_6c = pLVar10->x;
      local_64.x = local_6c;
      local_65 = value(this,(Lit)local_6c);
      local_6d = l_True.value;
      bVar5 = lbool::operator==(&local_65,l_True);
      if (!bVar5) {
        local_6e = value(this,local_64);
        bVar5 = lbool::operator==(&local_6e,l_False);
        if (bVar5) {
          p_00 = operator~(local_64);
          analyzeFinal(this,p_00,&this->conflict);
          this_local._7_1_ = l_False.value;
          goto LAB_00110b60;
        }
        local_60.x = local_64.x;
        break;
      }
      newDecisionLevel(this);
    }
    bVar5 = Lit::operator==(&local_60,(Lit)0xfffffffe);
    if (bVar5) {
      this->decisions = this->decisions + 1;
      local_60 = pickBranchLit(this);
      bVar5 = Lit::operator==(&local_60,(Lit)0xfffffffe);
      if (bVar5) {
        this_local._7_1_ = l_True.value;
LAB_00110b60:
        vec<Minisat::Lit,_int>::~vec((vec<Minisat::Lit,_int> *)local_38);
        return (lbool)this_local._7_1_;
      }
    }
    newDecisionLevel(this);
    uncheckedEnqueue(this,local_60,0xffffffff);
  }
  dVar13 = progressEstimate(this);
  this->progress_estimate = dVar13;
  cancelUntil(this,0);
  this_local._7_1_ = l_Undef;
  goto LAB_00110b60;
}

Assistant:

lbool Solver::search(int nof_conflicts)
{
    assert(ok);
    int         backtrack_level;
    int         conflictC = 0;
    vec<Lit>    learnt_clause;
    starts++;

    for (;;){
        CRef confl = propagate();
        if (confl != CRef_Undef){
            // CONFLICT
            conflicts++; conflictC++;
            if (decisionLevel() == 0) return l_False;

            learnt_clause.clear();
            analyze(confl, learnt_clause, backtrack_level);
            cancelUntil(backtrack_level);

            if (learnt_clause.size() == 1){
                uncheckedEnqueue(learnt_clause[0]);
            }else{
                CRef cr = ca.alloc(learnt_clause, true);
                learnts.push(cr);
                attachClause(cr);
                claBumpActivity(ca[cr]);
                uncheckedEnqueue(learnt_clause[0], cr);
            }

            varDecayActivity();
            claDecayActivity();

            if (--learntsize_adjust_cnt == 0){
                learntsize_adjust_confl *= learntsize_adjust_inc;
                learntsize_adjust_cnt    = (int)learntsize_adjust_confl;
                max_learnts             *= learntsize_inc;

                if (verbosity >= 1)
                    printf("| %9d | %7d %8d %8d | %8d %8d %6.0f | %6.3f %% |\n", 
                           (int)conflicts, 
                           (int)dec_vars - (trail_lim.size() == 0 ? trail.size() : trail_lim[0]), nClauses(), (int)clauses_literals, 
                           (int)max_learnts, nLearnts(), (double)learnts_literals/nLearnts(), progressEstimate()*100);
            }

        }else{
            // NO CONFLICT
            if ((nof_conflicts >= 0 && conflictC >= nof_conflicts) || !withinBudget()){
                // Reached bound on number of conflicts:
                progress_estimate = progressEstimate();
                cancelUntil(0);
                return l_Undef; }

            // Simplify the set of problem clauses:
            if (decisionLevel() == 0 && !simplify())
                return l_False;

            if (learnts.size()-nAssigns() >= max_learnts)
                // Reduce the set of learnt clauses:
                reduceDB();

            Lit next = lit_Undef;
            while (decisionLevel() < assumptions.size()){
                // Perform user provided assumption:
                Lit p = assumptions[decisionLevel()];
                if (value(p) == l_True){
                    // Dummy decision level:
                    newDecisionLevel();
                }else if (value(p) == l_False){
                    analyzeFinal(~p, conflict);
                    return l_False;
                }else{
                    next = p;
                    break;
                }
            }

            if (next == lit_Undef){
                // New variable decision:
                decisions++;
                next = pickBranchLit();

                if (next == lit_Undef)
                    // Model found:
                    return l_True;
            }

            // Increase decision level and enqueue 'next'
            newDecisionLevel();
            uncheckedEnqueue(next);
        }
    }
}